

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O3

int32_t icu_63::getSamplesFromString
                  (UnicodeString *samples,double *dest,int32_t destCapacity,UErrorCode *status)

{
  short sVar1;
  bool bVar2;
  bool bVar3;
  int32_t iVar4;
  int32_t iVar5;
  long lVar6;
  int iVar7;
  undefined4 length;
  int start;
  int iVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  FixedDecimal fixedLo;
  FixedDecimal fixedHi;
  int local_158;
  FixedDecimal local_130;
  UnicodeString local_f0;
  FixedDecimal local_b0;
  UnicodeString local_70;
  
  local_158 = 0;
  iVar8 = 0;
  do {
    if (destCapacity <= iVar8) {
      return iVar8;
    }
    sVar1 = (samples->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar7 = (samples->fUnion).fFields.fLength;
    }
    else {
      iVar7 = (int)sVar1 >> 5;
    }
    if (iVar7 <= local_158) {
      return iVar8;
    }
    start = 0;
    if (0 < local_158) {
      start = local_158;
    }
    iVar4 = UnicodeString::doIndexOf(samples,L',',start,iVar7 - start);
    if (iVar4 == -1) {
      sVar1 = (samples->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar4 = (samples->fUnion).fFields.fLength;
      }
      else {
        iVar4 = (int)sVar1 >> 5;
      }
    }
    UnicodeString::tempSubString(&local_f0,samples,local_158,iVar4 - local_158);
    length = local_f0.fUnion.fFields.fLength;
    if (-1 < local_f0.fUnion.fStackFields.fLengthAndFlags) {
      length = (int)local_f0.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    iVar5 = UnicodeString::doIndexOf(&local_f0,L'~',0,length);
    if (iVar5 < 0) {
      FixedDecimal::FixedDecimal(&local_130,&local_f0,status);
      dVar13 = local_130.source;
      dVar9 = floor(local_130.source);
      if (local_130.visibleDecimalDigitCount == 0) {
LAB_00275ec4:
        lVar6 = (long)iVar8;
        iVar8 = iVar8 + 1;
        dest[lVar6] = dVar13;
      }
      else if ((dVar13 != dVar9) || (NAN(dVar13) || NAN(dVar9))) goto LAB_00275ec4;
      UObject::~UObject(&local_130.super_UObject);
      IFixedDecimal::~IFixedDecimal(&local_130.super_IFixedDecimal);
LAB_00275ee7:
      local_158 = iVar4 + 1;
      bVar3 = false;
    }
    else {
      UnicodeString::tempSubString((UnicodeString *)&local_b0,&local_f0,0,iVar5);
      FixedDecimal::FixedDecimal(&local_130,(UnicodeString *)&local_b0,status);
      UnicodeString::~UnicodeString((UnicodeString *)&local_b0);
      UnicodeString::tempSubString(&local_70,&local_f0,iVar5 + 1,0x7ffffffe - iVar5);
      FixedDecimal::FixedDecimal(&local_b0,&local_70,status);
      UnicodeString::~UnicodeString(&local_70);
      dVar9 = local_b0.source;
      dVar13 = local_130.source;
      bVar3 = true;
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        if (local_b0.source < local_130.source) {
          *status = U_INVALID_FORMAT_ERROR;
          goto LAB_00275e4f;
        }
        dVar10 = floor(local_130.source);
        dVar14 = 1.0;
        if ((dVar10 != dVar13) || (NAN(dVar10) || NAN(dVar13))) {
          dVar14 = 1.0;
          dVar10 = dVar13;
          do {
            do {
              dVar10 = dVar10 * 10.0;
              dVar14 = dVar14 * 10.0;
              dVar11 = floor(dVar10);
            } while (dVar10 != dVar11);
          } while (NAN(dVar10) || NAN(dVar11));
        }
        dVar11 = floor(dVar9);
        dVar10 = 1.0;
        if ((dVar11 != dVar9) || (NAN(dVar11) || NAN(dVar9))) {
          dVar10 = 1.0;
          dVar11 = dVar9;
          do {
            do {
              dVar11 = dVar11 * 10.0;
              dVar10 = dVar10 * 10.0;
              dVar12 = floor(dVar11);
            } while (dVar11 != dVar12);
          } while (NAN(dVar11) || NAN(dVar12));
        }
        iVar5 = local_130.visibleDecimalDigitCount;
        if (dVar10 <= dVar14) {
          dVar10 = dVar14;
        }
        dVar13 = dVar13 * dVar10;
        bVar3 = false;
        bVar2 = true;
        do {
          if (dVar9 * dVar10 < dVar13) break;
          dVar14 = dVar13 / dVar10;
          dVar11 = floor(dVar14);
          if (((dVar14 != dVar11) || (NAN(dVar14) || NAN(dVar11))) || (iVar5 < 1)) {
            lVar6 = (long)iVar8;
            iVar8 = iVar8 + 1;
            dest[lVar6] = dVar14;
          }
          dVar13 = dVar13 + 1.0;
        } while (iVar8 < destCapacity);
      }
      else {
LAB_00275e4f:
        bVar2 = false;
      }
      UObject::~UObject(&local_b0.super_UObject);
      IFixedDecimal::~IFixedDecimal(&local_b0.super_IFixedDecimal);
      UObject::~UObject(&local_130.super_UObject);
      IFixedDecimal::~IFixedDecimal(&local_130.super_IFixedDecimal);
      if (bVar2) goto LAB_00275ee7;
    }
    UnicodeString::~UnicodeString(&local_f0);
    if (bVar3) {
      return iVar8;
    }
  } while( true );
}

Assistant:

static int32_t
getSamplesFromString(const UnicodeString &samples, double *dest,
                        int32_t destCapacity, UErrorCode& status) {
    int32_t sampleCount = 0;
    int32_t sampleStartIdx = 0;
    int32_t sampleEndIdx = 0;

    //std::string ss;  // TODO: debugging.
    // std::cout << "PluralRules::getSamples(), samples = \"" << samples.toUTF8String(ss) << "\"\n";
    for (sampleCount = 0; sampleCount < destCapacity && sampleStartIdx < samples.length(); ) {
        sampleEndIdx = samples.indexOf(COMMA, sampleStartIdx);
        if (sampleEndIdx == -1) {
            sampleEndIdx = samples.length();
        }
        const UnicodeString &sampleRange = samples.tempSubStringBetween(sampleStartIdx, sampleEndIdx);
        // ss.erase();
        // std::cout << "PluralRules::getSamples(), samplesRange = \"" << sampleRange.toUTF8String(ss) << "\"\n";
        int32_t tildeIndex = sampleRange.indexOf(TILDE);
        if (tildeIndex < 0) {
            FixedDecimal fixed(sampleRange, status);
            double sampleValue = fixed.source;
            if (fixed.visibleDecimalDigitCount == 0 || sampleValue != floor(sampleValue)) {
                dest[sampleCount++] = sampleValue;
            }
        } else {

            FixedDecimal fixedLo(sampleRange.tempSubStringBetween(0, tildeIndex), status);
            FixedDecimal fixedHi(sampleRange.tempSubStringBetween(tildeIndex+1), status);
            double rangeLo = fixedLo.source;
            double rangeHi = fixedHi.source;
            if (U_FAILURE(status)) {
                break;
            }
            if (rangeHi < rangeLo) {
                status = U_INVALID_FORMAT_ERROR;
                break;
            }

            // For ranges of samples with fraction decimal digits, scale the number up so that we
            //   are adding one in the units place. Avoids roundoffs from repetitive adds of tenths.

            double scale = scaleForInt(rangeLo);
            double t = scaleForInt(rangeHi);
            if (t > scale) {
                scale = t;
            }
            rangeLo *= scale;
            rangeHi *= scale;
            for (double n=rangeLo; n<=rangeHi; n+=1) {
                // Hack Alert: don't return any decimal samples with integer values that
                //    originated from a format with trailing decimals.
                //    This API is returning doubles, which can't distinguish having displayed
                //    zeros to the right of the decimal.
                //    This results in test failures with values mapping back to a different keyword.
                double sampleValue = n/scale;
                if (!(sampleValue == floor(sampleValue) && fixedLo.visibleDecimalDigitCount > 0)) {
                    dest[sampleCount++] = sampleValue;
                }
                if (sampleCount >= destCapacity) {
                    break;
                }
            }
        }
        sampleStartIdx = sampleEndIdx + 1;
    }
    return sampleCount;
}